

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O2

void fill_string_pool(xmlChar **strings,char **seeds)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  xmlChar *pxVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  xmlChar **local_38;
  
  local_38 = strings;
  for (uVar6 = 0; seeds[uVar6] != (char *)0x0; uVar6 = uVar6 + 1) {
    pxVar4 = (xmlChar *)xmlStrdup();
    *local_38 = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_00102fad;
    local_38 = local_38 + 1;
  }
  iVar8 = 0;
  uVar5 = 0;
  for (; uVar6 < 90000; uVar6 = uVar6 + 1) {
    pxVar4 = (xmlChar *)xmlStrncatNew(strings[iVar8],strings[uVar5],0xffffffffffffffff);
    *local_38 = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_00102fad;
    iVar3 = xmlStrlen(pxVar4);
    if (0x1e < iVar3) {
      fprintf(_stderr,"### %s %s\n",strings[(long)iVar8 + 90000],strings[uVar5]);
      abort();
    }
    bVar1 = 0x30 < iVar8;
    bVar2 = 0x30 < iVar8;
    iVar8 = iVar8 + 1;
    if (bVar2) {
      iVar8 = 0;
    }
    uVar5 = uVar5 + bVar1;
    local_38 = local_38 + 1;
  }
  iVar8 = 0;
  for (lVar9 = 0; (uVar7 = uVar6 + lVar9, (uint)lVar9 < 500 && (uVar7 < 100000)); lVar9 = lVar9 + 1)
  {
    pxVar4 = (xmlChar *)xmlStrncatNew(strings[iVar8],":",0xffffffffffffffff);
    *local_38 = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_00102fad;
    bVar1 = 0x15f8e < iVar8;
    iVar8 = iVar8 + 1;
    if (bVar1) {
      iVar8 = 0;
    }
    local_38 = local_38 + 1;
  }
  iVar8 = 0;
  iVar3 = 0;
  while( true ) {
    if (99999 < uVar7) {
      return;
    }
    pxVar4 = (xmlChar *)
             xmlStrncatNew(strings[(long)iVar8 + 90000],strings[iVar3],0xffffffffffffffff);
    *local_38 = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) break;
    bVar1 = 0x1f2 < iVar8;
    iVar8 = iVar8 + 1;
    if (bVar1) {
      iVar8 = 0;
    }
    bVar1 = 0x15f8a < iVar3;
    iVar3 = iVar3 + 5;
    if (bVar1) {
      iVar3 = 0;
    }
    uVar7 = uVar7 + 1;
    local_38 = local_38 + 1;
  }
LAB_00102fad:
  fwrite("Out of memory while generating strings\n",0x27,1,_stderr);
  exit(1);
}

Assistant:

static void
fill_string_pool(xmlChar **strings, const char **seeds) {
    int i, j, k;
    int start_ns = NB_STRINGS_MAX - NB_STRINGS_NS;

    /*
     * That's a bit nasty but the output is fine and it doesn't take hours
     * there is a small but sufficient number of duplicates, and we have
     * ":xxx" and full QNames in the last NB_STRINGS_NS values
     */
    for (i = 0; seeds[i] != NULL; i++) {
        strings[i] = xmlStrdup((const xmlChar *) seeds[i]);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
    }
    for (j = 0, k = 0; i < start_ns; i++) {
        strings[i] = xmlStrncatNew(strings[j], strings[k], -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        if (xmlStrlen(strings[i]) > 30) {
            fprintf(stderr, "### %s %s\n", strings[start_ns+j], strings[k]);
            abort();
        }
        j++;
	if (j >= 50) {
	    j = 0;
	    k++;
	}
    }
    for (j = 0, k = 0; (j < NB_STRINGS_PREFIX) && (i < NB_STRINGS_MAX);
         i++, j++) {
        strings[i] = xmlStrncatNew(strings[k], (const xmlChar *) ":", -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        k += 1;
        if (k >= start_ns) k = 0;
    }
    for (j = 0, k = 0; i < NB_STRINGS_MAX; i++) {
        strings[i] = xmlStrncatNew(strings[start_ns+j], strings[k], -1);
	if (strings[i] == NULL) {
	    fprintf(stderr, "Out of memory while generating strings\n");
	    exit(1);
	}
        j++;
        if (j >= NB_STRINGS_PREFIX) j = 0;
	k += 5;
        if (k >= start_ns) k = 0;
    }
}